

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

void __thiscall sentencepiece::SelfTestData::SelfTestData(SelfTestData *this,SelfTestData *from)

{
  InternalMetadata *this_00;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pCVar1;
  SelfTestData *from_local;
  SelfTestData *this_local;
  string *local_28;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)0x0;
  (this->super_MessageLite)._internal_metadata_.ptr_ = (void *)0x0;
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SelfTestData_0039d620;
  google::protobuf::internal::ExtensionSet::ExtensionSet(&this->_extensions_);
  google::protobuf::RepeatedPtrField<sentencepiece::SelfTestData_Sample>::RepeatedPtrField
            (&this->samples_,&from->samples_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  this_00 = &(from->super_MessageLite)._internal_metadata_;
  if (((uint)this_00->ptr_ & 1) == 1) {
    if (((uint)this_00->ptr_ & 1) == 1) {
      pCVar1 = google::protobuf::internal::InternalMetadata::
               PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                         (this_00);
      local_28 = &pCVar1->unknown_fields;
    }
    else {
      local_28 = (string *)(*(code *)0x0)();
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,local_28);
  }
  google::protobuf::internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  return;
}

Assistant:

SelfTestData::SelfTestData(const SelfTestData& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      samples_(from.samples_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  _extensions_.MergeFrom(from._extensions_);
  // @@protoc_insertion_point(copy_constructor:sentencepiece.SelfTestData)
}